

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsPacket.cpp
# Opt level: O2

int __thiscall CLPIParser::compose(CLPIParser *this,uint8_t *buffer,int bufferSize)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint32_t uVar6;
  uint uVar7;
  int iVar8;
  bool bVar9;
  BitStreamWriter writer;
  
  writer.super_BitStream.m_totalBits = 0;
  writer.m_curVal = 0;
  writer.m_bitWrited = 0;
  writer.super_BitStream.m_buffer = (uint *)0x0;
  writer.super_BitStream.m_initBuffer = (uint *)0x0;
  BitStreamWriter::setBuffer(&writer,buffer,buffer + bufferSize);
  CLPIStreamInfo::writeString("HDMV",&writer,4);
  CLPIStreamInfo::writeString(this->version_number,&writer,4);
  iVar1 = ((int)writer.super_BitStream.m_buffer - (int)writer.super_BitStream.m_initBuffer) * 8 +
          writer.m_bitWrited;
  BitStreamWriter::putBits(&writer,0x20,0);
  iVar2 = ((int)writer.super_BitStream.m_buffer - (int)writer.super_BitStream.m_initBuffer) * 8 +
          writer.m_bitWrited;
  BitStreamWriter::putBits(&writer,0x20,0);
  iVar3 = ((int)writer.super_BitStream.m_buffer - (int)writer.super_BitStream.m_initBuffer) * 8 +
          writer.m_bitWrited;
  BitStreamWriter::putBits(&writer,0x20,0);
  iVar4 = ((int)writer.super_BitStream.m_buffer - (int)writer.super_BitStream.m_initBuffer) * 8 +
          writer.m_bitWrited;
  BitStreamWriter::putBits(&writer,0x20,0);
  iVar5 = ((int)writer.super_BitStream.m_buffer - (int)writer.super_BitStream.m_initBuffer) * 8 +
          writer.m_bitWrited;
  BitStreamWriter::putBits(&writer,0x20,0);
  iVar8 = 3;
  while (bVar9 = iVar8 != 0, iVar8 = iVar8 + -1, bVar9) {
    BitStreamWriter::putBits(&writer,0x20,0);
  }
  composeClipInfo(this,&writer);
  while (uVar7 = ((int)writer.super_BitStream.m_buffer - (int)writer.super_BitStream.m_initBuffer) *
                 8 + writer.m_bitWrited, (uVar7 & 0x1f) != 0) {
    BitStreamWriter::putBits(&writer,8,0);
  }
  uVar6 = my_ntohl((int)uVar7 >> 3);
  *(uint32_t *)(buffer + iVar1 / 8) = uVar6;
  composeSequenceInfo(this,&writer);
  while (uVar7 = ((int)writer.super_BitStream.m_buffer - (int)writer.super_BitStream.m_initBuffer) *
                 8 + writer.m_bitWrited, (uVar7 & 0x1f) != 0) {
    BitStreamWriter::putBits(&writer,8,0);
  }
  uVar6 = my_ntohl((int)uVar7 >> 3);
  *(uint32_t *)(buffer + iVar2 / 8) = uVar6;
  composeProgramInfo(this,&writer,false);
  while (uVar7 = ((int)writer.super_BitStream.m_buffer - (int)writer.super_BitStream.m_initBuffer) *
                 8 + writer.m_bitWrited, (uVar7 & 0x1f) != 0) {
    BitStreamWriter::putBits(&writer,8,0);
  }
  uVar6 = my_ntohl((int)uVar7 >> 3);
  *(uint32_t *)(buffer + iVar3 / 8) = uVar6;
  composeCPI(this,&writer,false);
  while (uVar7 = ((int)writer.super_BitStream.m_buffer - (int)writer.super_BitStream.m_initBuffer) *
                 8 + writer.m_bitWrited, (uVar7 & 0x1f) != 0) {
    BitStreamWriter::putBits(&writer,8,0);
  }
  uVar6 = my_ntohl((int)uVar7 >> 3);
  *(uint32_t *)(buffer + iVar4 / 8) = uVar6;
  composeClipMark(&writer);
  while (uVar7 = ((int)writer.super_BitStream.m_buffer - (int)writer.super_BitStream.m_initBuffer) *
                 8 + writer.m_bitWrited, (uVar7 & 0x1f) != 0) {
    BitStreamWriter::putBits(&writer,8,0);
  }
  uVar6 = my_ntohl((int)uVar7 >> 3);
  *(uint32_t *)(buffer + iVar5 / 8) = uVar6;
  composeExtentInfo(this,&writer);
  while ((((int)writer.super_BitStream.m_buffer - (int)writer.super_BitStream.m_initBuffer) * 8 +
          writer.m_bitWrited & 0x1f) != 0) {
    BitStreamWriter::putBits(&writer,8,0);
  }
  BitStreamWriter::flushBits(&writer);
  return (int)(((int)writer.super_BitStream.m_buffer - (int)writer.super_BitStream.m_initBuffer) * 8
              + writer.m_bitWrited) / 8;
}

Assistant:

int CLPIParser::compose(uint8_t* buffer, const int bufferSize)
{
    BitStreamWriter writer{};
    writer.setBuffer(buffer, buffer + bufferSize);
    CLPIStreamInfo::writeString("HDMV", writer, 4);
    CLPIStreamInfo::writeString(version_number, writer, 4);
    const auto sequenceInfo_pos = reinterpret_cast<uint32_t*>(buffer + writer.getBitsCount() / 8);
    writer.putBits(32, 0);  // sequenceInfo_start_address
    const auto programInfo_pos = reinterpret_cast<uint32_t*>(buffer + writer.getBitsCount() / 8);
    writer.putBits(32, 0);  // programInfo_start_address
    const auto CPI_pos = reinterpret_cast<uint32_t*>(buffer + writer.getBitsCount() / 8);
    writer.putBits(32, 0);  // CPI start address
    const auto clipMark_pos = reinterpret_cast<uint32_t*>(buffer + writer.getBitsCount() / 8);
    writer.putBits(32, 0);  // clipMark
    const auto extentInfo_pos = reinterpret_cast<uint32_t*>(buffer + writer.getBitsCount() / 8);
    writer.putBits(32, 0);                              // extent info
    for (int i = 0; i < 3; i++) writer.putBits(32, 0);  // reserved_for_future_use

    composeClipInfo(writer);
    while (writer.getBitsCount() % 32 != 0) writer.putBits(8, 0);
    *sequenceInfo_pos = my_htonl(writer.getBitsCount() / 8);
    composeSequenceInfo(writer);
    while (writer.getBitsCount() % 32 != 0) writer.putBits(8, 0);

    *programInfo_pos = my_htonl(writer.getBitsCount() / 8);
    composeProgramInfo(writer, false);
    while (writer.getBitsCount() % 32 != 0) writer.putBits(8, 0);

    *CPI_pos = my_htonl(writer.getBitsCount() / 8);
    composeCPI(writer, false);
    while (writer.getBitsCount() % 32 != 0) writer.putBits(8, 0);

    *clipMark_pos = my_htonl(writer.getBitsCount() / 8);
    composeClipMark(writer);
    while (writer.getBitsCount() % 32 != 0) writer.putBits(8, 0);

    *extentInfo_pos = my_htonl(writer.getBitsCount() / 8);
    composeExtentInfo(writer);
    while (writer.getBitsCount() % 32 != 0) writer.putBits(8, 0);

    writer.flushBits();
    return writer.getBitsCount() / 8;
}